

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O3

void FuzzyHammerer::generate_pattern_for_ARM
               (int acts,int *rows_to_access,int max_accesses,size_t probes_per_pattern)

{
  size_type *psVar1;
  pointer pAVar2;
  pointer pAVar3;
  int base_period;
  undefined1 auStack_3cd0 [8];
  PatternBuilder pattern_builder;
  FuzzingParameterSet fuzzing_params;
  PatternAddressMapper mapper;
  long local_48 [2];
  int local_34;
  
  FuzzingParameterSet::FuzzingParameterSet
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,acts);
  FuzzingParameterSet::print_static_parameters
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
  FuzzingParameterSet::randomize_parameters
            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,true);
  if (hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
      .super__Vector_impl_data._M_start) {
    hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
    super__Vector_impl_data._M_finish =
         hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  if (cnt_pattern_probes < probes_per_pattern && 1 < cnt_pattern_probes) {
    cnt_pattern_probes = cnt_pattern_probes + 1;
  }
  else {
    cnt_pattern_probes = 0;
    base_period = FuzzingParameterSet::get_base_period
                            ((FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
    HammeringPattern::HammeringPattern
              ((HammeringPattern *)&fuzzing_params.flushing_strategy,base_period);
    local_34 = max_accesses;
    std::__cxx11::string::operator=
              ((string *)&hammering_pattern,(string *)&fuzzing_params.flushing_strategy);
    pAVar3 = hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    pAVar2 = hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    hammering_pattern.is_location_dependent = (bool)mapper.victim_rows._M_h._M_single_bucket._0_1_;
    hammering_pattern._49_7_ = mapper.victim_rows._M_h._M_rehash_policy._M_next_resize._1_7_;
    hammering_pattern._32_8_ = mapper.victim_rows._M_h._M_element_count;
    hammering_pattern.max_period._0_1_ =
         mapper.victim_rows._M_h._M_rehash_policy._M_max_load_factor._0_1_;
    hammering_pattern.max_period._1_7_ = mapper.victim_rows._M_h._M_rehash_policy._1_7_;
    hammering_pattern.total_activations._0_1_ =
         (undefined1)mapper.victim_rows._M_h._M_rehash_policy._M_next_resize;
    hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)mapper.instance_id._M_dataplus._M_p;
    hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)mapper.instance_id._M_string_length;
    hammering_pattern.aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)mapper.instance_id.field_2._M_allocated_capacity;
    mapper.instance_id._M_dataplus._M_p = (pointer)0x0;
    mapper.instance_id._M_string_length = 0;
    mapper.instance_id.field_2._M_allocated_capacity = 0;
    if (pAVar2 != (pointer)0x0) {
      operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2);
    }
    pattern_builder.gen._M_x[0] =
         (unsigned_long)
         hammering_pattern.agg_access_patterns.
         super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    pattern_builder.pattern =
         (HammeringPattern *)
         hammering_pattern.agg_access_patterns.
         super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>._M_impl
         .super__Vector_impl_data._M_finish;
    auStack_3cd0 = (undefined1  [8])
                   hammering_pattern.agg_access_patterns.
                   super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    hammering_pattern.agg_access_patterns.
    super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)mapper.instance_id.field_2._8_8_;
    hammering_pattern.agg_access_patterns.
    super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)mapper.gen._M_x[0];
    hammering_pattern.agg_access_patterns.
    super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)mapper.gen._M_x[1];
    mapper.instance_id.field_2._8_8_ = 0;
    mapper.gen._M_x[0] = 0;
    mapper.gen._M_x[1] = 0;
    std::vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>::~vector
              ((vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
               auStack_3cd0);
    pattern_builder.gen._M_x[0] =
         (unsigned_long)
         hammering_pattern.address_mappings.
         super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pattern_builder.pattern =
         (HammeringPattern *)
         hammering_pattern.address_mappings.
         super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_3cd0 = (undefined1  [8])
                   hammering_pattern.address_mappings.
                   super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    hammering_pattern.address_mappings.
    super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)mapper.gen._M_x[2];
    hammering_pattern.address_mappings.
    super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)mapper.gen._M_x[3];
    hammering_pattern.address_mappings.
    super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)mapper.gen._M_x[4];
    mapper.gen._M_x[2] = 0;
    mapper.gen._M_x[3] = 0;
    mapper.gen._M_x[4] = 0;
    std::vector<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>::~vector
              ((vector<PatternAddressMapper,_std::allocator<PatternAddressMapper>_> *)auStack_3cd0);
    std::vector<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>::~vector
              ((vector<PatternAddressMapper,_std::allocator<PatternAddressMapper>_> *)
               (mapper.gen._M_x + 2));
    std::vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>::~vector
              ((vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
               ((long)&mapper.instance_id.field_2 + 8));
    if (mapper.instance_id._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(mapper.instance_id._M_dataplus._M_p,
                      mapper.instance_id.field_2._M_allocated_capacity -
                      (long)mapper.instance_id._M_dataplus._M_p);
    }
    max_accesses = local_34;
    if ((size_type *)fuzzing_params._5248_8_ != &mapper.victim_rows._M_h._M_bucket_count) {
      operator_delete((void *)fuzzing_params._5248_8_,mapper.victim_rows._M_h._M_bucket_count + 1);
    }
  }
  PatternBuilder::PatternBuilder((PatternBuilder *)auStack_3cd0,&hammering_pattern);
  PatternBuilder::generate_frequency_based_pattern
            ((PatternBuilder *)auStack_3cd0,
             (FuzzingParameterSet *)&pattern_builder.aggressor_id_counter);
  psVar1 = &mapper.victim_rows._M_h._M_bucket_count;
  fuzzing_params._5248_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&fuzzing_params.flushing_strategy,
             "Aggressor pairs, given as \"(id ...) : freq, amp, start_offset\":","");
  Logger::log_info((string *)&fuzzing_params.flushing_strategy,true);
  if ((size_type *)fuzzing_params._5248_8_ != psVar1) {
    operator_delete((void *)fuzzing_params._5248_8_,mapper.victim_rows._M_h._M_bucket_count + 1);
  }
  HammeringPattern::get_agg_access_pairs_text_repr_abi_cxx11_
            ((string *)&fuzzing_params.flushing_strategy,&hammering_pattern);
  Logger::log_data((string *)&fuzzing_params.flushing_strategy,true);
  if ((size_type *)fuzzing_params._5248_8_ != psVar1) {
    operator_delete((void *)fuzzing_params._5248_8_,mapper.victim_rows._M_h._M_bucket_count + 1);
  }
  PatternAddressMapper::PatternAddressMapper
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy);
  PatternAddressMapper::randomize_addresses
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy,
             (FuzzingParameterSet *)&pattern_builder.aggressor_id_counter,
             &hammering_pattern.agg_access_patterns,true);
  PatternAddressMapper::export_pattern
            ((PatternAddressMapper *)&fuzzing_params.flushing_strategy,&hammering_pattern.aggressors
             ,(long)hammering_pattern.base_period,rows_to_access,(long)max_accesses);
  mapper._5200_8_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&mapper.reproducibility_score,
             "Aggressor ID to DRAM address mapping (bank, rank, column):","");
  Logger::log_info((string *)&mapper.reproducibility_score,true);
  if ((long *)mapper._5200_8_ != local_48) {
    operator_delete((void *)mapper._5200_8_,local_48[0] + 1);
  }
  PatternAddressMapper::get_mapping_text_repr_abi_cxx11_
            ((string *)&mapper.reproducibility_score,
             (PatternAddressMapper *)&fuzzing_params.flushing_strategy);
  Logger::log_data((string *)&mapper.reproducibility_score,true);
  if ((long *)mapper._5200_8_ != local_48) {
    operator_delete((void *)mapper._5200_8_,local_48[0] + 1);
  }
  std::
  vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
  ::~vector((vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
             *)&mapper.aggressor_to_addr._M_h._M_single_bucket);
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&mapper.bank_no);
  std::unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_>::~unique_ptr
            ((unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_> *)&mapper.gen._M_p);
  if ((size_type *)
      CONCAT71(mapper.victim_rows._M_h._M_single_bucket._1_7_,
               mapper.victim_rows._M_h._M_single_bucket._0_1_) !=
      &mapper.instance_id._M_string_length) {
    operator_delete((undefined1 *)
                    CONCAT71(mapper.victim_rows._M_h._M_single_bucket._1_7_,
                             mapper.victim_rows._M_h._M_single_bucket._0_1_),
                    mapper.instance_id._M_string_length + 1);
  }
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&fuzzing_params.flushing_strategy);
  if (fuzzing_params.N_sided_probabilities._M_param._M_prob.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(fuzzing_params.N_sided_probabilities._M_param._M_prob.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)fuzzing_params.N_sided_probabilities._M_param._M_cp.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)fuzzing_params.N_sided_probabilities._M_param._M_prob.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (fuzzing_params._5192_8_ != 0) {
    operator_delete((void *)fuzzing_params._5192_8_,
                    (long)fuzzing_params.N_sided_probabilities._M_param._M_prob.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - fuzzing_params._5192_8_);
  }
  return;
}

Assistant:

void FuzzyHammerer::generate_pattern_for_ARM(int acts,
                                             int *rows_to_access,
                                             int max_accesses,
                                             const size_t probes_per_pattern) {
  FuzzingParameterSet fuzzing_params(acts);
  fuzzing_params.print_static_parameters();
  fuzzing_params.randomize_parameters(true);

  hammering_pattern.aggressors.clear();
  if (cnt_pattern_probes > 1 && cnt_pattern_probes < probes_per_pattern) {
    cnt_pattern_probes++;
  } else {
    cnt_pattern_probes = 0;
    hammering_pattern = HammeringPattern(fuzzing_params.get_base_period());
  }

  PatternBuilder pattern_builder(hammering_pattern);
  pattern_builder.generate_frequency_based_pattern(fuzzing_params);

  Logger::log_info("Aggressor pairs, given as \"(id ...) : freq, amp, start_offset\":");
  Logger::log_data(hammering_pattern.get_agg_access_pairs_text_repr());

  // choose random addresses for pattern
  PatternAddressMapper mapper;
  mapper.randomize_addresses(fuzzing_params, hammering_pattern.agg_access_patterns, true);
  mapper.export_pattern(hammering_pattern.aggressors, hammering_pattern.base_period, rows_to_access, max_accesses);
  Logger::log_info("Aggressor ID to DRAM address mapping (bank, rank, column):");
  Logger::log_data(mapper.get_mapping_text_repr());
}